

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

PktOut * pq_out_after(PacketQueueBase *pqb,PacketQueueNode *prev,_Bool pop)

{
  size_t *psVar1;
  PacketQueueBase *pPVar2;
  PacketQueueNode *pPVar3;
  PacketQueueNode *pPVar4;
  PktOut *pPVar5;
  size_t sVar6;
  
  pPVar2 = (PacketQueueBase *)prev->next;
  if (pPVar2 == pqb) {
    pPVar5 = (PktOut *)0x0;
  }
  else {
    if (pop) {
      pPVar3 = (pPVar2->end).next;
      pPVar4 = (pPVar2->end).prev;
      pPVar3->prev = pPVar4;
      pPVar4->next = pPVar3;
      psVar1 = &(pPVar2->end).formal_size;
      sVar6 = pqb->total_size - *psVar1;
      if (pqb->total_size < *psVar1) {
        __assert_fail("pqb->total_size >= node->formal_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c"
                      ,0x56,"void pq_unlink_common(PacketQueueBase *, PacketQueueNode *)");
      }
      pqb->total_size = sVar6;
      if ((sVar6 != 0) && ((PacketQueueBase *)(pqb->end).next == pqb)) {
        __assert_fail("pqb->end.next != &pqb->end || pqb->total_size == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c"
                      ,0x5c,"void pq_unlink_common(PacketQueueBase *, PacketQueueNode *)");
      }
      (pPVar2->end).next = (PacketQueueNode *)0x0;
      (pPVar2->end).prev = (PacketQueueNode *)0x0;
    }
    pPVar5 = (PktOut *)&pPVar2[-2].total_size;
  }
  return pPVar5;
}

Assistant:

static PktOut *pq_out_after(PacketQueueBase *pqb,
                            PacketQueueNode *prev, bool pop)
{
    PacketQueueNode *node = prev->next;
    if (node == &pqb->end)
        return NULL;

    if (pop) {
        pq_unlink_common(pqb, node);

        node->prev = node->next = NULL;
    }

    return container_of(node, PktOut, qnode);
}